

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn.c
# Opt level: O3

void Qiniu_Free_CDNFluxRet(Qiniu_CDN_FluxRet *ret)

{
  void *pvVar1;
  Qiniu_CDN_FluxData *pQVar2;
  long lVar3;
  long lVar4;
  
  pQVar2 = ret->data;
  if (pQVar2 != (Qiniu_CDN_FluxData *)0x0) {
    if (0 < ret->domainsCount) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        pQVar2 = ret->data;
        pvVar1 = *(void **)((long)&pQVar2->china + lVar3);
        if (pvVar1 != (void *)0x0) {
          Qiniu_Free(pvVar1);
          pQVar2 = ret->data;
        }
        pvVar1 = *(void **)((long)&pQVar2->oversea + lVar3);
        if (pvVar1 != (void *)0x0) {
          Qiniu_Free(pvVar1);
        }
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x28;
      } while (lVar4 < ret->domainsCount);
      pQVar2 = ret->data;
    }
    Qiniu_Free(pQVar2);
    return;
  }
  return;
}

Assistant:

void Qiniu_Free_CDNFluxRet(Qiniu_CDN_FluxRet *ret) {
    int i;

    if (ret->data != NULL) {
        for (i = 0; i < ret->domainsCount; ++i) {
            if (ret->data[i].china != NULL) {
                Qiniu_Free(ret->data[i].china);
            }
            if (ret->data[i].oversea != NULL) {
                Qiniu_Free(ret->data[i].oversea);
            }
        }
        Qiniu_Free(ret->data);
    }
}